

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.hpp
# Opt level: O2

int mxx::exscan<int,mxx::max<int>>(undefined8 x,long param_2)

{
  int iVar1;
  int result;
  custom_op<int,_true> op;
  
  custom_op<int,true>::custom_op<mxx::max<int>>((custom_op<int,true> *)&op);
  MPI_Exscan(x,&result,1,op.m_type_copy,op.m_op,*(undefined8 *)(param_2 + 8));
  iVar1 = *(int *)(param_2 + 0x14);
  if (*(int *)(param_2 + 0x14) != 0) {
    iVar1 = result;
  }
  custom_op<int,_true>::~custom_op(&op);
  return iVar1;
}

Assistant:

T exscan(const T& x, Func func, const mxx::comm& comm = mxx::comm()) {
    // get op
    mxx::custom_op<T> op(std::forward<Func>(func));
    // perform reduction
    T result;
    MPI_Exscan(const_cast<T*>(&x), &result, 1, op.get_type(), op.get_op(), comm);
    if (comm.rank() == 0)
      result = T();
    return result;
}